

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.c
# Opt level: O2

unsigned_long strchrcount(char *haystack,char needle)

{
  unsigned_long uVar1;
  
  uVar1 = 0;
  if (haystack != (char *)0x0) {
    for (; *haystack != '\0'; haystack = haystack + 1) {
      uVar1 = uVar1 + (*haystack == needle);
    }
  }
  return uVar1;
}

Assistant:

unsigned long strchrcount(char * haystack, char needle)
{
	unsigned long       i=0;

	if(!haystack)
		return 0;

	while(*haystack)
	{
		if(*haystack==needle)
			i++;

		haystack++;
	}

	return i;
}